

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O1

VirtualIterator<Kernel::TypedTermList> __thiscall
Kernel::EqHelper::getRewritableVarsIterator
          (EqHelper *this,DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *unstableVars,
          Literal *lit,Ordering *ord)

{
  undefined8 *puVar1;
  size_t sVar2;
  TypedTermList *pTVar3;
  TypedTermList *pTVar4;
  TypedTermList *pTVar5;
  Result RVar6;
  void **head_1;
  TermList *pTVar7;
  undefined8 *puVar8;
  Term *t;
  RewritableVarsIt *this_00;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::TypedTermList>_>_>
  local_248;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::TypedTermList>_>_>
  local_210;
  RewritableVarsIt local_1d8;
  IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
  local_178;
  RewritableVarsIt local_e0;
  RewritableVarsIt local_80;
  
  RVar6 = Ordering::getEqualityArgumentOrder(ord,lit);
  switch(RVar6) {
  case GREATER:
  case EQUAL:
    pTVar7 = (lit->super_Term)._args + (*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
    break;
  case LESS:
    pTVar7 = (lit->super_Term)._args +
             ((ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - 1);
    break;
  case INCOMPARABLE:
    RewritableVarsIt::RewritableVarsIt(&local_80,unstableVars,&lit->super_Term,false);
    ::Lib::iterTraits<Kernel::RewritableVarsIt>
              ((IterTraits<Kernel::RewritableVarsIt> *)&local_1d8,&local_80);
    ::Lib::IterTraits<Kernel::RewritableVarsIt>::unique
              (&local_178,(IterTraits<Kernel::RewritableVarsIt> *)&local_1d8);
    ::Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::persistent(&local_210,&local_178);
    puVar8 = (undefined8 *)::operator_new(0x48,8);
    pTVar5 = local_210._iter._iter._func.a._end;
    pTVar4 = local_210._iter._iter._func.a._cursor;
    pTVar3 = local_210._iter._iter._func.a._stack;
    sVar2 = local_210._iter._iter._func.a._capacity;
    local_210._iter._iter._func.a._capacity = 0;
    local_210._iter._iter._func.a._end = (TypedTermList *)0x0;
    puVar8[8] = local_210._iter._iter._inner._to;
    puVar8[6] = local_210._iter._iter._inner._next;
    puVar8[7] = local_210._iter._iter._inner._from;
    *(undefined4 *)(puVar8 + 1) = 0;
    *puVar8 = &PTR__ProxyIterator_00b67398;
    puVar8[2] = 0;
    puVar8[3] = 0;
    puVar8[4] = 0;
    puVar8[5] = 0;
    puVar8[2] = sVar2;
    puVar8[5] = pTVar5;
    puVar1 = (undefined8 *)puVar8[3];
    local_210._iter._iter._func.a._stack = (TypedTermList *)0x0;
    local_210._iter._iter._func.a._cursor = (TypedTermList *)0x0;
    puVar8[3] = pTVar3;
    puVar8[4] = pTVar4;
    *(undefined8 **)this = puVar8;
    *(undefined4 *)(puVar8 + 1) = 1;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
    }
    RewritableVarsIt::~RewritableVarsIt(&local_178._iter._iter._inn);
    ::Lib::Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash>::clear
              ((Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash> *)&local_178);
    RewritableVarsIt::~RewritableVarsIt(&local_1d8);
    this_00 = &local_80;
    goto LAB_0052e2ab;
  default:
    t = (Term *)0x2;
    goto LAB_0052e17e;
  }
  t = (Term *)pTVar7->_content;
LAB_0052e17e:
  if (((ulong)t & 3) == 0) {
    RewritableVarsIt::RewritableVarsIt(&local_e0,unstableVars,t,true);
    ::Lib::iterTraits<Kernel::RewritableVarsIt>
              ((IterTraits<Kernel::RewritableVarsIt> *)&local_1d8,&local_e0);
    ::Lib::IterTraits<Kernel::RewritableVarsIt>::unique
              (&local_178,(IterTraits<Kernel::RewritableVarsIt> *)&local_1d8);
    ::Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::persistent(&local_248,&local_178);
    puVar8 = (undefined8 *)::operator_new(0x48,8);
    pTVar5 = local_248._iter._iter._func.a._end;
    pTVar4 = local_248._iter._iter._func.a._cursor;
    pTVar3 = local_248._iter._iter._func.a._stack;
    sVar2 = local_248._iter._iter._func.a._capacity;
    local_248._iter._iter._func.a._capacity = 0;
    local_248._iter._iter._func.a._end = (TypedTermList *)0x0;
    puVar8[8] = local_248._iter._iter._inner._to;
    puVar8[6] = local_248._iter._iter._inner._next;
    puVar8[7] = local_248._iter._iter._inner._from;
    *(undefined4 *)(puVar8 + 1) = 0;
    *puVar8 = &PTR__ProxyIterator_00b67398;
    puVar8[2] = 0;
    puVar8[3] = 0;
    puVar8[4] = 0;
    puVar8[5] = 0;
    puVar8[2] = sVar2;
    puVar8[5] = pTVar5;
    puVar1 = (undefined8 *)puVar8[3];
    local_248._iter._iter._func.a._stack = (TypedTermList *)0x0;
    local_248._iter._iter._func.a._cursor = (TypedTermList *)0x0;
    puVar8[3] = pTVar3;
    puVar8[4] = pTVar4;
    *(undefined8 **)this = puVar8;
    *(undefined4 *)(puVar8 + 1) = 1;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
    }
    RewritableVarsIt::~RewritableVarsIt(&local_178._iter._iter._inn);
    ::Lib::Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash>::clear
              ((Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash> *)&local_178);
    RewritableVarsIt::~RewritableVarsIt(&local_1d8);
    this_00 = &local_e0;
LAB_0052e2ab:
    RewritableVarsIt::~RewritableVarsIt(this_00);
  }
  else {
    ::Lib::VirtualIterator<Kernel::TypedTermList>::getEmpty();
  }
  return (VirtualIterator<Kernel::TypedTermList>)(IteratorCore<Kernel::TypedTermList> *)this;
}

Assistant:

VirtualIterator<TypedTermList> EqHelper::getRewritableVarsIterator(DHSet<unsigned>* unstableVars, Literal* lit, const Ordering& ord)
{
  ASS(lit->isEquality());
    
  TermList sel;
  switch(ord.getEqualityArgumentOrder(lit)) {
  case Ordering::INCOMPARABLE: {
    return pvi(iterTraits(RewritableVarsIt(unstableVars, lit))
      .unique()
      .persistent());
  }
  case Ordering::EQUAL:
  case Ordering::GREATER:
    sel=*lit->nthArgument(0);
    break;
  case Ordering::LESS:
    sel=*lit->nthArgument(1);
    break;
#if VDEBUG
  default:
    ASSERTION_VIOLATION;
#endif
  }
  if (!sel.isTerm()) {
    return VirtualIterator<TypedTermList>::getEmpty();
  }
  return pvi(iterTraits(RewritableVarsIt(unstableVars, sel.term(), true)).unique().persistent());
}